

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O2

void swrenderer::R_EnterPortal(PortalDrawseg *pds,int depth)

{
  byte *pbVar1;
  short sVar2;
  line_t_conflict *src;
  vertex_t *pvVar3;
  ushort uVar4;
  undefined8 uVar5;
  double dVar6;
  DAngle DVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  BYTE *pBVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  TVector3<double> local_a8;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  DVector2 local_48;
  
  DVar7.Degrees = ViewAngle.Degrees;
  dVar6 = ViewPos.Z;
  if (depth < r_portal_recursions.Value) {
    if (camera == (AActor *)0x0) {
      bVar16 = true;
    }
    else {
      bVar16 = ((camera->renderflags).Value & 0x8000) == 0;
    }
    CurrentPortalUniq = CurrentPortalUniq + 1;
    uVar15 = (ulong)DAT_00726b8c;
    src = (line_t_conflict *)pds->src;
    local_58 = ViewPos.X;
    dStack_50 = ViewPos.Y;
    local_68 = ViewPath[0].Z;
    dStack_60 = ViewPath[1].X;
    local_78 = ViewPath[0].X;
    dStack_70 = ViewPath[0].Y;
    local_88 = ViewPath[1].Y;
    dStack_80 = ViewPath[1].Z;
    if (pds->mirror == true) {
      pvVar3 = src->v1;
      local_a8.X = (src->delta).X;
      if (local_a8.X == 0.0) {
        dVar20 = (pvVar3->p).X;
        ViewPos.X = (dVar20 + dVar20) - ViewPos.X;
        local_a8.Y = (src->delta).Y;
      }
      else {
        local_a8.Y = (src->delta).Y;
        if (local_a8.Y == 0.0) {
          dVar20 = (pvVar3->p).Y;
          ViewPos.Y = (dVar20 + dVar20) - ViewPos.Y;
        }
        else {
          dVar20 = (pvVar3->p).X;
          dVar21 = (pvVar3->p).Y;
          dVar17 = (src->v2->p).X - dVar20;
          dVar18 = (src->v2->p).Y - dVar21;
          dVar19 = ((ViewPos.X - dVar20) * dVar17 + dVar18 * (ViewPos.Y - dVar21)) /
                   (dVar18 * dVar18 + dVar17 * dVar17);
          dVar20 = dVar19 * dVar17 + dVar20;
          dVar21 = dVar19 * dVar18 + dVar21;
          ViewPos.X = (dVar20 + dVar20) - ViewPos.X;
          ViewPos.Y = (dVar21 + dVar21) - ViewPos.Y;
        }
      }
      TVector2<double>::Angle(&local_48);
      ViewAngle.Degrees = (local_48.X + local_48.X) - DVar7.Degrees;
    }
    else {
      P_TranslatePortalXY(src,&ViewPos.X,&ViewPos.Y);
      P_TranslatePortalZ((line_t_conflict *)pds->src,&ViewPos.Z);
      P_TranslatePortalAngle((line_t_conflict *)pds->src,&ViewAngle);
      P_TranslatePortalXY((line_t_conflict *)pds->src,&ViewPath[0].X,&ViewPath[0].Y);
      P_TranslatePortalXY((line_t_conflict *)pds->src,&ViewPath[1].X,&ViewPath[1].Y);
      if ((r_showviewer == false) && (camera != (AActor *)0x0)) {
        local_a8.X = ViewPath[0].X;
        local_a8.Y = ViewPath[0].Y;
        iVar8 = P_PointOnLineSidePrecise((DVector2 *)&local_a8,(line_t_conflict *)pds->dst);
        local_48.X = ViewPath[1].X;
        local_48.Y = ViewPath[1].Y;
        iVar9 = P_PointOnLineSidePrecise(&local_48,(line_t_conflict *)pds->dst);
        if (iVar8 != iVar9) {
          local_a8.Z = ViewPath[0].Z - ViewPath[1].Z;
          local_a8.X = ViewPath[0].X - ViewPath[1].X;
          local_a8.Y = ViewPath[0].Y - ViewPath[1].Y;
          dVar20 = TVector3<double>::Length(&local_a8);
          if (1.52587890625e-05 < dVar20) {
            local_a8.Z = ViewPos.Z - ViewPath[0].Z;
            local_a8.X = ViewPos.X - ViewPath[0].X;
            local_a8.Y = ViewPos.Y - ViewPath[0].Y;
            dVar21 = TVector3<double>::Length(&local_a8);
            local_a8.Z = ViewPos.Z - ViewPath[1].Z;
            local_a8.X = ViewPos.X - ViewPath[1].X;
            local_a8.Y = ViewPos.Y - ViewPath[1].Y;
            dVar17 = TVector3<double>::Length(&local_a8);
            if (dVar17 + dVar21 < dVar20 + 1.0) {
              (camera->renderflags).Value = (camera->renderflags).Value | 0x8000;
            }
          }
        }
      }
    }
    ViewSin = TAngle<double>::Sin(&ViewAngle);
    ViewCos = TAngle<double>::Cos(&ViewAngle);
    ViewTanSin = ViewSin * FocalTangent;
    ViewTanCos = FocalTangent * ViewCos;
    R_CopyStackedViewParameters();
    uVar5 = CurrentPortal;
    validcount = validcount + 1;
    CurrentPortal = pds;
    R_ClearPlanes(false);
    R_ClearClipSegs((short)pds->x1,(short)pds->x2);
    uVar4 = _MirrorFlags;
    WindowLeft = pds->x1;
    WindowRight = pds->x2;
    if (pds->mirror == true) {
      _MirrorFlags = _MirrorFlags ^ 1;
    }
    R_3D_EnterSkybox();
    CurrentPortalInSkybox = 0;
    memcpy(&ceilingclip + pds->x1,(pds->ceilingclip).Array,(long)pds->len * 2);
    memcpy(&floorclip + pds->x1,(pds->floorclip).Array,(long)pds->len * 2);
    InSubsector = 0;
    R_RenderBSPNode(nodes + (long)numnodes + -1);
    R_3D_ResetClip();
    if ((bool)(bVar16 & camera != (AActor *)0x0)) {
      pbVar1 = (byte *)((long)&(camera->renderflags).Value + 1);
      *pbVar1 = *pbVar1 & 0x7f;
    }
    cycle_t::Clock(&PlaneCycles);
    R_DrawPlanes();
    R_DrawPortals();
    cycle_t::Unclock(&PlaneCycles);
    iVar8 = CurrentPortalUniq;
    uVar13 = (ulong)DAT_00726b8c;
    lVar14 = uVar15 * 0x48;
    for (; iVar9 = CurrentPortalUniq, uVar15 < uVar13; uVar15 = uVar15 + 1) {
      R_EnterPortal((PortalDrawseg *)(WallPortals + lVar14),depth + 1);
      lVar14 = lVar14 + 0x48;
    }
    CurrentPortalUniq = iVar8;
    NetUpdate();
    cycle_t::Clock(&MaskedCycles);
    R_DrawMasked();
    cycle_t::Unclock(&MaskedCycles);
    NetUpdate();
    R_3D_LeaveSkybox();
    CurrentPortalUniq = iVar9;
    if (r_highlight_portals.Value == true) {
      R_HighlightPortal(pds);
    }
    ViewPos.X = local_58;
    ViewPos.Y = dStack_50;
    ViewPath[0].X = local_78;
    ViewPath[0].Y = dStack_70;
    ViewPath[1].Y = local_88;
    ViewPath[1].Z = dStack_80;
    ViewPath[0].Z = local_68;
    ViewPath[1].X = dStack_60;
    _MirrorFlags = uVar4;
    CurrentPortal = (PortalDrawseg *)uVar5;
    ViewPos.Z = dVar6;
    ViewAngle.Degrees = DVar7.Degrees;
  }
  else {
    iVar9 = BestColor((uint32 *)&GPalette,0,0,0,0,0xff);
    iVar8 = RenderTarget->Pitch;
    for (uVar10 = pds->x1; (int)uVar10 < pds->x2; uVar10 = uVar10 + 1) {
      if ((-1 < (int)uVar10) && ((int)uVar10 < RenderTarget->Width)) {
        lVar14 = (long)(int)uVar10 - (long)pds->x1;
        iVar11 = (int)(pds->ceilingclip).Array[lVar14];
        sVar2 = (pds->floorclip).Array[lVar14];
        pBVar12 = RenderTarget->Buffer + (long)(iVar8 * iVar11) + (ulong)uVar10;
        for (; iVar11 <= sVar2; iVar11 = iVar11 + 1) {
          *pBVar12 = (BYTE)iVar9;
          pBVar12 = pBVar12 + iVar8;
        }
      }
    }
    if (r_highlight_portals.Value != false) {
      R_HighlightPortal(pds);
      return;
    }
  }
  return;
}

Assistant:

void R_EnterPortal (PortalDrawseg* pds, int depth)
{
	// [ZZ] check depth. fill portal with black if it's exceeding the visual recursion limit, and continue like nothing happened.
	if (depth >= r_portal_recursions)
	{
		BYTE color = (BYTE)BestColor((DWORD *)GPalette.BaseColors, 0, 0, 0, 0, 255);
		int spacing = RenderTarget->GetPitch();
		for (int x = pds->x1; x < pds->x2; x++)
		{
			if (x < 0 || x >= RenderTarget->GetWidth())
				continue;

			int Ytop = pds->ceilingclip[x-pds->x1];
			int Ybottom = pds->floorclip[x-pds->x1];

			BYTE *dest = RenderTarget->GetBuffer() + x + Ytop * spacing;

			for (int y = Ytop; y <= Ybottom; y++)
			{
				*dest = color;
				dest += spacing;
			}
		}

		if (r_highlight_portals)
			R_HighlightPortal(pds);

		return;
	}

	DAngle startang = ViewAngle;
	DVector3 startpos = ViewPos;
	DVector3 savedpath[2] = { ViewPath[0], ViewPath[1] };
	ActorRenderFlags savedvisibility = camera? camera->renderflags & RF_INVISIBLE : ActorRenderFlags::FromInt(0);

	CurrentPortalUniq++;

	unsigned int portalsAtStart = WallPortals.Size ();

	if (pds->mirror)
	{
		//vertex_t *v1 = ds->curline->v1;
		vertex_t *v1 = pds->src->v1;

		// Reflect the current view behind the mirror.
		if (pds->src->Delta().X == 0)
		{ // vertical mirror
			ViewPos.X = v1->fX() - startpos.X + v1->fX();
		}
		else if (pds->src->Delta().Y == 0)
		{ // horizontal mirror
			ViewPos.Y = v1->fY() - startpos.Y + v1->fY();
		}
		else
		{ // any mirror
			vertex_t *v2 = pds->src->v2;

			double dx = v2->fX() - v1->fX();
			double dy = v2->fY() - v1->fY();
			double x1 = v1->fX();
			double y1 = v1->fY();
			double x = startpos.X;
			double y = startpos.Y;

			// the above two cases catch len == 0
			double r = ((x - x1)*dx + (y - y1)*dy) / (dx*dx + dy*dy);

			ViewPos.X = (x1 + r * dx)*2 - x;
			ViewPos.Y = (y1 + r * dy)*2 - y;
		}
		ViewAngle = pds->src->Delta().Angle() * 2 - startang;
	}
	else
	{
		P_TranslatePortalXY(pds->src, ViewPos.X, ViewPos.Y);
		P_TranslatePortalZ(pds->src, ViewPos.Z);
		P_TranslatePortalAngle(pds->src, ViewAngle);
		P_TranslatePortalXY(pds->src, ViewPath[0].X, ViewPath[0].Y);
		P_TranslatePortalXY(pds->src, ViewPath[1].X, ViewPath[1].Y);

		if (!r_showviewer && camera && P_PointOnLineSidePrecise(ViewPath[0], pds->dst) != P_PointOnLineSidePrecise(ViewPath[1], pds->dst))
		{
			double distp = (ViewPath[0] - ViewPath[1]).Length();
			if (distp > EQUAL_EPSILON)
			{
				double dist1 = (ViewPos - ViewPath[0]).Length();
				double dist2 = (ViewPos - ViewPath[1]).Length();

				if (dist1 + dist2 < distp + 1)
				{
					camera->renderflags |= RF_INVISIBLE;
				}
			}
		}
	}

	ViewSin = ViewAngle.Sin();
	ViewCos = ViewAngle.Cos();

	ViewTanSin = FocalTangent * ViewSin;
	ViewTanCos = FocalTangent * ViewCos;

	R_CopyStackedViewParameters();

	validcount++;
	PortalDrawseg* prevpds = CurrentPortal;
	CurrentPortal = pds;

	R_ClearPlanes (false);
	R_ClearClipSegs (pds->x1, pds->x2);

	WindowLeft = pds->x1;
	WindowRight = pds->x2;
	
	// RF_XFLIP should be removed before calling the root function
	int prevmf = MirrorFlags;
	if (pds->mirror)
	{
		if (MirrorFlags & RF_XFLIP)
			MirrorFlags &= ~RF_XFLIP;
		else MirrorFlags |= RF_XFLIP;
	}

	// some portals have height differences, account for this here
	R_3D_EnterSkybox(); // push 3D floor height map
	CurrentPortalInSkybox = false; // first portal in a skybox should set this variable to false for proper clipping in skyboxes.

	// first pass, set clipping
	memcpy (ceilingclip + pds->x1, &pds->ceilingclip[0], pds->len*sizeof(*ceilingclip));
	memcpy (floorclip + pds->x1, &pds->floorclip[0], pds->len*sizeof(*floorclip));

	InSubsector = NULL;
	R_RenderBSPNode (nodes + numnodes - 1);
	R_3D_ResetClip(); // reset clips (floor/ceiling)
	if (!savedvisibility && camera) camera->renderflags &= ~RF_INVISIBLE;

	PlaneCycles.Clock();
	R_DrawPlanes ();
	R_DrawPortals ();
	PlaneCycles.Unclock();

	double vzp = ViewPos.Z;

	int prevuniq = CurrentPortalUniq;
	// depth check is in another place right now
	unsigned int portalsAtEnd = WallPortals.Size ();
	for (; portalsAtStart < portalsAtEnd; portalsAtStart++)
	{
		R_EnterPortal (&WallPortals[portalsAtStart], depth + 1);
	}
	int prevuniq2 = CurrentPortalUniq;
	CurrentPortalUniq = prevuniq;

	NetUpdate();

	MaskedCycles.Clock(); // [ZZ] count sprites in portals/mirrors along with normal ones.
	R_DrawMasked ();	  //      this is required since with portals there often will be cases when more than 80% of the view is inside a portal.
	MaskedCycles.Unclock();

	NetUpdate();

	R_3D_LeaveSkybox(); // pop 3D floor height map
	CurrentPortalUniq = prevuniq2;

	// draw a red line around a portal if it's being highlighted
	if (r_highlight_portals)
		R_HighlightPortal(pds);

	CurrentPortal = prevpds;
	MirrorFlags = prevmf;
	ViewAngle = startang;
	ViewPos = startpos;
	ViewPath[0] = savedpath[0];
	ViewPath[1] = savedpath[1];
}